

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

void __thiscall kj::_::Debug::Fault::~Fault(Fault *this)

{
  Exception *pEVar1;
  undefined1 local_168 [8];
  Exception copy;
  Fault *this_local;
  
  if (this->exception != (Exception *)0x0) {
    copy._336_8_ = this;
    pEVar1 = mv<kj::Exception>(this->exception);
    Exception::Exception((Exception *)local_168,pEVar1);
    pEVar1 = this->exception;
    if (pEVar1 != (Exception *)0x0) {
      Exception::~Exception(pEVar1);
      operator_delete(pEVar1,0x158);
    }
    pEVar1 = mv<kj::Exception>((Exception *)local_168);
    throwRecoverableException(pEVar1,2);
    Exception::~Exception((Exception *)local_168);
  }
  return;
}

Assistant:

Debug::Fault::~Fault() noexcept(false) {
  if (exception != nullptr) {
    Exception copy = mv(*exception);
    delete exception;
    throwRecoverableException(mv(copy), 2);
  }
}